

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

LogHelper * util::operator<<(LogHelper *h,ttycmd cmd)

{
  bool bVar1;
  LogHelper *h_00;
  
  bVar1 = is_stdout_a_tty();
  if (bVar1) {
    switch(cmd) {
    case cleartoeol:
      std::operator<<(h->screen,"\x1b[0K");
      break;
    case clearline:
      h_00 = operator<<(h,(char (*) [2])0x1a9cd3);
      operator<<(h_00,cleartoeol);
      h->clearline = false;
      break;
    case statusbegin:
      h->statusmsg = true;
      break;
    case statusend:
      h->statusmsg = false;
      h->clearline = true;
    }
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, ttycmd cmd)
{
    if (util::is_stdout_a_tty())
    {
        switch (cmd)
        {
        case ttycmd::statusbegin:
            h.statusmsg = true;
            break;

        case ttycmd::statusend:
            h.statusmsg = false;
            h.clearline = true;
            break;

        case ttycmd::clearline:
            h << "\r" << ttycmd::cleartoeol;
            h.clearline = false;
            break;

        case ttycmd::cleartoeol:
#ifdef _WIN32
            h.screen->flush();

            DWORD dwWritten;
            CONSOLE_SCREEN_BUFFER_INFO csbi{};
            HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);

            if (GetConsoleScreenBufferInfo(hConsole, &csbi))
                FillConsoleOutputCharacter(hConsole, ' ', csbi.dwSize.X - csbi.dwCursorPosition.X, csbi.dwCursorPosition, &dwWritten);
#else
            * h.screen << "\x1b[0K";
#endif
            break;
        }
    }
    return h;
}